

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionValidatesLengthAndChecksum::RunImpl
          (TestsessionFixtureSessionValidatesLengthAndChecksum *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_648 [8];
  sessionFixtureSessionValidatesLengthAndChecksumHelper fixtureHelper;
  bool ctorOk;
  TestsessionFixtureSessionValidatesLengthAndChecksum *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  sessionFixtureSessionValidatesLengthAndChecksumHelper::
  sessionFixtureSessionValidatesLengthAndChecksumHelper
            ((sessionFixtureSessionValidatesLengthAndChecksumHelper *)local_648,
             &(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionValidatesLengthAndChecksumHelper>
            ((sessionFixtureSessionValidatesLengthAndChecksumHelper *)local_648,
             &(this->super_Test).m_details);
  sessionFixtureSessionValidatesLengthAndChecksumHelper::
  ~sessionFixtureSessionValidatesLengthAndChecksumHelper
            ((sessionFixtureSessionValidatesLengthAndChecksumHelper *)local_648);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionValidatesLengthAndChecksum) {
  createSession(1);
  object->setValidateLengthAndChecksum(true);
  CHECK(object->getValidateLengthAndChecksum());
}